

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O1

vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> * __thiscall
dg::dda::MemorySSATransformation::findDefinitions
          (vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *__return_storage_ptr__,
          MemorySSATransformation *this,RWNode *node,DefSite *ds)

{
  RWBBlock *block;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> defSet;
  Definitions D;
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  local_f0;
  Definitions local_c0;
  
  block = node->bblock;
  findDefinitionsInBlock(&local_c0,node,(RWNode *)0x0);
  (__return_storage_ptr__->super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Definitions::get((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                    *)&local_f0,&local_c0,ds);
  std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
  _M_range_insert<std::_Rb_tree_const_iterator<dg::dda::RWNode*>>
            ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)__return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             local_f0._M_impl.super__Rb_tree_header._M_header._M_left,
             &local_f0._M_impl.super__Rb_tree_header);
  addUncoveredFromPredecessors(this,block,&local_c0,ds,__return_storage_ptr__);
  std::
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  ::_M_erase(&local_f0,(_Link_type)local_f0._M_impl.super__Rb_tree_header._M_header._M_parent);
  if (local_c0.unknownWrites.
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.unknownWrites.
                    super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.unknownWrites.
                          super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.unknownWrites.
                          super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_c0.kills);
  std::
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_c0.definitions);
  return __return_storage_ptr__;
}

Assistant:

std::vector<RWNode *>
MemorySSATransformation::findDefinitions(RWNode *node, const DefSite &ds) {
    DBG(dda, "Searching definitions for node " << node->getID());

    // we use this only for PHI nodes
    assert(ds.target && "Target is null");
    assert(!ds.target->isUnknown() && "Searching unknown memory");

    auto *block = node->getBBlock();
    assert(block && "Need bblock");

    // gather all definitions from the beginning of the block
    // to the node (we must do that always, because adding PHI
    // nodes changes the definitions)
    auto D = findDefinitionsInBlock(node);
    std::vector<RWNode *> defs;

    // add the definitions from the beginning of this block to the defs
    // container
    auto defSet = D.get(ds);
    assert((!defSet.empty() || D.unknownWrites.empty()) &&
           "BUG: if we found no definitions, also unknown writes must be "
           "empty");
    defs.insert(defs.end(), defSet.begin(), defSet.end());

    addUncoveredFromPredecessors(block, D, ds, defs);

    return defs;
}